

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant_impl.hpp
# Opt level: O0

void __thiscall
type_safe::detail::
move_assign_union_value<type_safe::optional_variant_policy,type_safe::tagged_union<int,double,debugger_type>>
::visitor::operator()
          (visitor *this,debugger_type *value,tagged_union<int,_double,_debugger_type> *dest)

{
  bool bVar1;
  equality_comparison<type_safe::tagged_union<int,_double,_debugger_type>::type_id> *lhs;
  union_type<debugger_type> local_29;
  undefined8 local_28;
  type_id id;
  tagged_union<int,_double,_debugger_type> *dest_local;
  debugger_type *value_local;
  visitor *this_local;
  
  local_28 = 3;
  id.
  super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>.
  value_ = (strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
            )(strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
              )dest;
  lhs = (equality_comparison<type_safe::tagged_union<int,_double,_debugger_type>::type_id> *)
        tagged_union<int,_double,_debugger_type>::type(dest);
  bVar1 = strong_typedef_op::operator==
                    (lhs,(equality_comparison<type_safe::tagged_union<int,_double,_debugger_type>::type_id>
                          *)&local_28);
  if (bVar1) {
    do_assign<debugger_type,void>
              (this,(tagged_union<int,_double,_debugger_type> *)
                    id.
                    super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
                    .value_,value);
  }
  else {
    union_type<debugger_type>::union_type(&local_29);
    optional_variant_policy::change_value<debugger_type,int,double,debugger_type,debugger_type>
              (id.
               super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
               .value_,value);
  }
  return;
}

Assistant:

void operator()(T&& value, Union& dest)
            {
                constexpr auto id =
                    typename Union::type_id(union_type<typename std::decay<T>::type>{});
                if (dest.type() == id)
                    do_assign(dest, std::move(value));
                else
                    VariantPolicy::change_value(union_type<typename std::decay<T>::type>{}, dest,
                                                std::move(value));
            }